

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O0

void nghttp2_map_each_free(nghttp2_map *map,_func_int_void_ptr_void_ptr *func,void *ptr)

{
  nghttp2_map_bucket *bkt;
  uint32_t i;
  void *ptr_local;
  _func_int_void_ptr_void_ptr *func_local;
  nghttp2_map *map_local;
  
  for (bkt._4_4_ = 0; bkt._4_4_ < map->tablelen; bkt._4_4_ = bkt._4_4_ + 1) {
    if (map->table[bkt._4_4_].data != (void *)0x0) {
      (*func)(map->table[bkt._4_4_].data,ptr);
    }
  }
  return;
}

Assistant:

void nghttp2_map_each_free(nghttp2_map *map, int (*func)(void *data, void *ptr),
                           void *ptr) {
  uint32_t i;
  nghttp2_map_bucket *bkt;

  for (i = 0; i < map->tablelen; ++i) {
    bkt = &map->table[i];

    if (bkt->data == NULL) {
      continue;
    }

    func(bkt->data, ptr);
  }
}